

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayFeatureExtractor.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ArrayFeatureExtractor::MergeFrom
          (ArrayFeatureExtractor *this,ArrayFeatureExtractor *from)

{
  ulong uVar1;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/ArrayFeatureExtractor.pb.cc"
               ,0xc3);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom
            (&this->extractindex_,&from->extractindex_);
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void ArrayFeatureExtractor::MergeFrom(const ArrayFeatureExtractor& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.ArrayFeatureExtractor)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  extractindex_.MergeFrom(from.extractindex_);
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}